

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.cpp
# Opt level: O0

PtrTokenOrSyntax * __thiscall
slang::syntax::DefaultPropertyCaseItemSyntax::getChildPtr
          (DefaultPropertyCaseItemSyntax *this,size_t index)

{
  undefined8 in_RSI;
  PtrTokenOrSyntax *in_RDI;
  SyntaxNode *in_stack_ffffffffffffffc8;
  PtrTokenOrSyntax *local_10;
  
  switch(in_RSI) {
  case 0:
    PtrTokenOrSyntax::PtrTokenOrSyntax(in_RDI,(Token *)in_stack_ffffffffffffffc8);
    break;
  case 1:
    PtrTokenOrSyntax::PtrTokenOrSyntax(in_RDI,(Token *)in_stack_ffffffffffffffc8);
    break;
  case 2:
    not_null<slang::syntax::PropertyExprSyntax_*>::get
              ((not_null<slang::syntax::PropertyExprSyntax_*> *)
               ((long)&in_RDI[3].super_variant<slang::parsing::Token_*,_slang::syntax::SyntaxNode_*>
                       .super__Variant_base<slang::parsing::Token_*,_slang::syntax::SyntaxNode_*>.
                       super__Move_assign_alias<slang::parsing::Token_*,_slang::syntax::SyntaxNode_*>
                       .
                       super__Copy_assign_alias<slang::parsing::Token_*,_slang::syntax::SyntaxNode_*>
                       .super__Move_ctor_alias<slang::parsing::Token_*,_slang::syntax::SyntaxNode_*>
                       .super__Copy_ctor_alias<slang::parsing::Token_*,_slang::syntax::SyntaxNode_*>
                       .
                       super__Variant_storage_alias<slang::parsing::Token_*,_slang::syntax::SyntaxNode_*>
               + 8));
    PtrTokenOrSyntax::PtrTokenOrSyntax(in_RDI,in_stack_ffffffffffffffc8);
    break;
  case 3:
    PtrTokenOrSyntax::PtrTokenOrSyntax(in_RDI,(Token *)in_stack_ffffffffffffffc8);
    break;
  default:
    PtrTokenOrSyntax::PtrTokenOrSyntax(in_RDI,in_stack_ffffffffffffffc8);
  }
  return local_10;
}

Assistant:

PtrTokenOrSyntax DefaultPropertyCaseItemSyntax::getChildPtr(size_t index) {
    switch (index) {
        case 0: return &defaultKeyword;
        case 1: return &colon;
        case 2: return expr.get();
        case 3: return &semi;
        default: return nullptr;
    }
}